

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O3

void writeVariableSizedInteger(uint64_t Integer,size_t Size,raw_ostream *OS,bool IsLittleEndian)

{
  undefined7 in_register_00000009;
  undefined1 *__buf;
  int __fd;
  uint uVar1;
  ulong local_18;
  uint local_10;
  ushort local_c;
  undefined1 local_9;
  
  uVar1 = (uint)Integer;
  switch(Size) {
  case 1:
    __fd = (int)&local_9;
    local_9 = (undefined1)Integer;
    __buf = (undefined1 *)0x1;
    break;
  case 2:
    local_c = (ushort)Integer;
    if (!IsLittleEndian) {
      local_c = local_c << 8 | local_c >> 8;
    }
    __fd = (int)&local_c;
    __buf = (undefined1 *)0x2;
    break;
  default:
    __assert_fail("false && \"Invalid integer write size.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFEmitter.cpp"
                  ,0x37,"void writeVariableSizedInteger(uint64_t, size_t, raw_ostream &, bool)");
  case 4:
    local_10 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (IsLittleEndian) {
      local_10 = uVar1;
    }
    __fd = (int)&local_10;
    __buf = (undefined1 *)0x4;
    break;
  case 8:
    local_18 = Integer >> 0x38 | (Integer & 0xff000000000000) >> 0x28 |
               (Integer & 0xff0000000000) >> 0x18 | (Integer & 0xff00000000) >> 8 |
               (Integer & 0xff000000) << 8 | (Integer & 0xff0000) << 0x18 |
               (Integer & 0xff00) << 0x28 | Integer << 0x38;
    if (IsLittleEndian) {
      local_18 = Integer;
    }
    __fd = (int)&local_18;
    __buf = &DAT_00000008;
  }
  llvm::raw_ostream::write(OS,__fd,__buf,CONCAT71(in_register_00000009,IsLittleEndian));
  return;
}

Assistant:

static void writeVariableSizedInteger(uint64_t Integer, size_t Size,
                                      raw_ostream &OS, bool IsLittleEndian) {
  if (8 == Size)
    writeInteger((uint64_t)Integer, OS, IsLittleEndian);
  else if (4 == Size)
    writeInteger((uint32_t)Integer, OS, IsLittleEndian);
  else if (2 == Size)
    writeInteger((uint16_t)Integer, OS, IsLittleEndian);
  else if (1 == Size)
    writeInteger((uint8_t)Integer, OS, IsLittleEndian);
  else
    assert(false && "Invalid integer write size.");
}